

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableModel::ensureSorted(QTableModel *this,int column,SortOrder order,int start,int end)

{
  int *piVar1;
  int movedFromRow;
  parameter_type pQVar2;
  QTableWidgetItem *pQVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  iterator __first;
  iterator __last;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  pointer ppQVar11;
  pointer ppVar12;
  int movedToRow;
  int iVar13;
  ulong uVar14;
  long lVar15;
  char *__filename;
  char *__filename_00;
  code *__comp;
  ulong uVar16;
  ulong uVar17;
  int j;
  long in_FS_OFFSET;
  ulong local_140;
  long local_138;
  QArrayDataPointer<QModelIndex> local_108;
  iterator local_f0;
  QArrayDataPointer<QTableWidgetItem_*> local_e8;
  QArrayDataPointer<QTableWidgetItem_*> local_c8;
  QArrayDataPointer<QTableWidgetItem_*> local_b0;
  QArrayDataPointer<QModelIndex> local_98;
  QTableWidgetItem *itm;
  QModelIndex *pQStack_70;
  qsizetype local_68;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QTableWidgetItem_*,_int> *)0x0;
  local_58.size = 0;
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58,(long)((end - start) + 1));
  while( true ) {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,start);
    if ((end < start) || (itm = item(this,start,column), itm == (QTableWidgetItem *)0x0)) break;
    QList<std::pair<QTableWidgetItem*,int>>::emplaceBack<QTableWidgetItem*&,int&>
              ((QList<std::pair<QTableWidgetItem*,int>> *)&local_58,&itm,(int *)&local_98);
    start = (int)local_98.d + 1;
  }
  __comp = itemGreaterThan;
  if (order == AscendingOrder) {
    __comp = itemLessThan;
  }
  __first = QList<std::pair<QTableWidgetItem_*,_int>_>::begin
                      ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58);
  __last = QList<std::pair<QTableWidgetItem_*,_int>_>::end
                     ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58);
  std::
  __stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
              )__comp);
  local_68 = 0;
  itm = (QTableWidgetItem *)0x0;
  pQStack_70 = (QModelIndex *)0x0;
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QModelIndex *)0x0;
  local_b0.d = (this->tableItems).d.d;
  local_b0.ptr = (this->tableItems).d.ptr;
  local_b0.size = (this->tableItems).d.size;
  if (local_b0.d != (Data *)0x0) {
    LOCK();
    ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d = (this->verticalHeaderItems).d.d;
  local_c8.ptr = (this->verticalHeaderItems).d.ptr;
  local_c8.size = (this->verticalHeaderItems).d.size;
  if (local_c8.d != (Data *)0x0) {
    LOCK();
    ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  columnItems((QList<QTableWidgetItem_*> *)&local_e8,this,column);
  iVar8 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_e8);
  local_138 = 0x18;
  local_140 = 1;
  bVar5 = false;
  for (uVar17 = 0; uVar17 < (ulong)local_58.size; uVar17 = uVar17 + 1) {
    iVar9 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_e8);
    movedFromRow = local_58.ptr[uVar17].second;
    __filename_00 = (char *)(long)movedFromRow;
    pQVar2 = local_e8.ptr[(long)__filename_00];
    QList<QTableWidgetItem_*>::remove((QList<QTableWidgetItem_*> *)&local_e8,__filename_00);
    iVar10 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_e8);
    local_108.d = (Data *)((long)iVar10.i + ((long)iVar8.i - (long)iVar9.i));
    local_f0 = QList<QTableWidgetItem_*>::end((QList<QTableWidgetItem_*> *)&local_e8);
    iVar8 = sortedInsertionIterator((iterator *)&local_108,&local_f0,order,pQVar2);
    iVar9 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_e8);
    movedToRow = (int)((ulong)((long)iVar8.i - (long)iVar9.i) >> 3);
    if (movedToRow < 1) {
      movedToRow = 0;
    }
    if (movedToRow < movedFromRow) {
      iVar6 = (*pQVar2->_vptr_QTableWidgetItem[5])(pQVar2,local_e8.ptr[movedFromRow - 1U]);
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*local_e8.ptr[movedFromRow - 1U]->_vptr_QTableWidgetItem[5])
                            (local_e8.ptr[movedFromRow - 1U],pQVar2), (char)iVar6 == '\0')) {
        movedToRow = movedFromRow;
      }
    }
    iVar8 = QList<QTableWidgetItem_*>::insert((QList<QTableWidgetItem_*> *)&local_e8,iVar8.i,pQVar2)
    ;
    if (movedToRow != movedFromRow) {
      if (!bVar5) {
        local_108.d = (Data *)0x0;
        local_108.ptr = (QModelIndex *)0x0;
        local_108.size = 0;
        QAbstractItemModel::layoutAboutToBeChanged
                  ((QList_conflict *)this,(LayoutChangeHint)&local_108);
        QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
                  ((QArrayDataPointer<QPersistentModelIndex> *)&local_108);
        QAbstractItemModel::persistentIndexList();
        QArrayDataPointer<QModelIndex>::operator=((QArrayDataPointer<QModelIndex> *)&itm,&local_108)
        ;
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_108);
        QArrayDataPointer<QModelIndex>::operator=(&local_98,(QArrayDataPointer<QModelIndex> *)&itm);
        bVar5 = true;
      }
      local_108.d = (Data *)0xffffffffffffffff;
      local_108.ptr = (QModelIndex *)0x0;
      local_108.size = 0;
      uVar7 = (**(code **)(*(long *)this + 0x80))(this,&local_108);
      local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_108.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)&local_108,(long)(int)uVar7);
      uVar16 = 0;
      if (0 < (int)uVar7) {
        uVar16 = (ulong)uVar7;
      }
      for (uVar14 = 0;
          __filename = (char *)((this->horizontalHeaderItems).d.size * (long)__filename_00),
          uVar16 != uVar14; uVar14 = uVar14 + 1) {
        pQVar3 = local_b0.ptr[(long)(__filename + uVar14)];
        ppQVar11 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&local_108);
        ppQVar11[uVar14] = pQVar3;
      }
      QList<QTableWidgetItem_*>::remove((QList<QTableWidgetItem_*> *)&local_b0,__filename);
      lVar15 = (long)movedToRow;
      QList<QTableWidgetItem_*>::insert
                ((QList<QTableWidgetItem_*> *)&local_b0,
                 (this->horizontalHeaderItems).d.size * lVar15,(long)(int)uVar7,(parameter_type)0x0)
      ;
      for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        pQVar3 = *(QTableWidgetItem **)(&(local_108.ptr)->r + uVar14 * 2);
        lVar4 = (this->horizontalHeaderItems).d.size;
        ppQVar11 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&local_b0);
        ppQVar11[lVar4 * lVar15 + uVar14] = pQVar3;
      }
      pQVar2 = local_c8.ptr[(long)__filename_00];
      QList<QTableWidgetItem_*>::remove((QList<QTableWidgetItem_*> *)&local_c8,__filename_00);
      QList<QTableWidgetItem_*>::insert((QList<QTableWidgetItem_*> *)&local_c8,lVar15,pQVar2);
      updateRowIndexes(this,(QModelIndexList *)&local_98,movedFromRow,movedToRow);
      lVar15 = local_138;
      for (uVar16 = local_140; uVar16 < (ulong)local_58.size; uVar16 = uVar16 + 1) {
        iVar6 = *(int *)((long)&(local_58.ptr)->first + lVar15);
        if (((movedFromRow < iVar6) && (iVar13 = -1, iVar6 <= movedToRow)) ||
           ((iVar6 < movedFromRow && (iVar13 = 1, movedToRow <= iVar6)))) {
          ppVar12 = QList<std::pair<QTableWidgetItem_*,_int>_>::data
                              ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58);
          piVar1 = (int *)((long)&ppVar12->first + lVar15);
          *piVar1 = *piVar1 + iVar13;
        }
        lVar15 = lVar15 + 0x10;
      }
      QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer
                ((QArrayDataPointer<QTableWidgetItem_*> *)&local_108);
    }
    local_138 = local_138 + 0x10;
    local_140 = local_140 + 1;
  }
  if (bVar5) {
    QArrayDataPointer<QTableWidgetItem_*>::operator=(&(this->tableItems).d,&local_b0);
    QArrayDataPointer<QTableWidgetItem_*>::operator=(&(this->verticalHeaderItems).d,&local_c8);
    QAbstractItemModel::changePersistentIndexList((QList_conflict *)this,(QList_conflict *)&itm);
    local_108.d = (Data *)0x0;
    local_108.ptr = (QModelIndex *)0x0;
    local_108.size = 0;
    QAbstractItemModel::layoutChanged((QList_conflict *)this,(LayoutChangeHint)&local_108);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_108);
  }
  QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&itm);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::ensureSorted(int column, Qt::SortOrder order,
                               int start, int end)
{
    int count = end - start + 1;
    QList<std::pair<QTableWidgetItem *, int>> sorting;
    sorting.reserve(count);
    for (int row = start; row <= end; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        sorting.emplace_back(itm, row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);
    QModelIndexList oldPersistentIndexes, newPersistentIndexes;
    QList<QTableWidgetItem *> newTable = tableItems;
    QList<QTableWidgetItem *> newVertical = verticalHeaderItems;
    QList<QTableWidgetItem *> colItems = columnItems(column);
    QList<QTableWidgetItem *>::iterator vit = colItems.begin();
    qsizetype distanceFromBegin = 0;
    bool changed = false;
    for (int i = 0; i < sorting.size(); ++i) {
        distanceFromBegin = std::distance(colItems.begin(), vit);
        int oldRow = sorting.at(i).second;
        QTableWidgetItem *item = colItems.at(oldRow);
        colItems.remove(oldRow);
        vit = sortedInsertionIterator(colItems.begin() + distanceFromBegin, colItems.end(), order,
                                      item);
        int newRow = qMax((int)(vit - colItems.begin()), 0);
        if ((newRow < oldRow) && !(*item < *colItems.at(oldRow - 1)) && !(*colItems.at(oldRow - 1) < *item))
            newRow = oldRow;
        vit = colItems.insert(vit, item);
        if (newRow != oldRow) {
            if (!changed) {
                emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);
                oldPersistentIndexes = persistentIndexList();
                newPersistentIndexes = oldPersistentIndexes;
                changed = true;
            }
            // move the items @ oldRow to newRow
            int cc = columnCount();
            QList<QTableWidgetItem *> rowItems(cc);
            for (int j = 0; j < cc; ++j)
                rowItems[j] = newTable.at(tableIndex(oldRow, j));
            newTable.remove(tableIndex(oldRow, 0), cc);
            newTable.insert(tableIndex(newRow, 0), cc, 0);
            for (int j = 0; j < cc; ++j)
                newTable[tableIndex(newRow, j)] = rowItems.at(j);
            QTableWidgetItem *header = newVertical.at(oldRow);
            newVertical.remove(oldRow);
            newVertical.insert(newRow, header);
            // update persistent indexes
            updateRowIndexes(newPersistentIndexes, oldRow, newRow);
            // the index of the remaining rows may have changed
            for (int j = i + 1; j < sorting.size(); ++j) {
                int otherRow = sorting.at(j).second;
                if (oldRow < otherRow && newRow >= otherRow)
                    --sorting[j].second;
                else if (oldRow > otherRow && newRow <= otherRow)
                    ++sorting[j].second;
            }
        }
    }

    if (changed) {
        tableItems = newTable;
        verticalHeaderItems = newVertical;
        changePersistentIndexList(oldPersistentIndexes,
                                  newPersistentIndexes);
        emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
    }
}